

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

void matd_ltriangle_solve(matd_t *L,double *b,double *x)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  double dVar6;
  
  uVar1 = L->ncols;
  iVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (uVar4 = 0; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    dVar6 = b[uVar4];
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      dVar6 = dVar6 - (double)L[(ulong)(uint)(iVar2 + (int)uVar5) + 1] * x[uVar5];
    }
    x[uVar4] = dVar6 / (double)L[(ulong)((uVar1 + 1) * (int)uVar4) + 1];
    iVar2 = iVar2 + uVar1;
  }
  return;
}

Assistant:

void matd_ltriangle_solve(matd_t *L, const TYPE *b, TYPE *x)
{
    int n = L->ncols;

    for (int i = 0; i < n; i++) {
        double acc = b[i];

        for (int j = 0; j < i; j++) {
            acc -= MATD_EL(L, i, j)*x[j];
        }

        x[i] = acc / MATD_EL(L, i, i);
    }
}